

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O2

int get_request(curl_socket_t sock,httprequest *req)

{
  byte bVar1;
  byte *pbVar2;
  unsigned_short uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  char *pcVar9;
  uint *puVar10;
  size_t sVar11;
  size_t sVar12;
  ulong uVar13;
  long *plVar14;
  int *piVar15;
  char *pcVar16;
  ulong uVar17;
  char *pcVar18;
  byte *pbVar19;
  size_t __n;
  size_t sVar20;
  bool bVar21;
  int prot_minor;
  int prot_major;
  char *local_218;
  char *local_210;
  char *local_208;
  char *endp;
  char logbuf [456];
  
  if (req->pipelining == false) {
    uVar13 = req->offset;
    if (uVar13 < 149999) {
LAB_00106cb6:
      if (req->skip == 0) {
        sVar11 = 149999 - uVar13;
      }
      else {
        sVar11 = req->cl;
      }
      lVar8 = recv(sock,req->reqbuf + uVar13,sVar11,0);
      goto LAB_00106cdb;
    }
LAB_001076c5:
    pcVar18 = "Request would overflow buffer, closing connection";
LAB_001076cc:
    uVar6 = 0xffffffff;
    logmsg(pcVar18);
    req->reqbuf[149999] = '\0';
LAB_001076dd:
    storerequest(req->reqbuf,(&req->checkindex)[req->pipelining ^ 1]);
LAB_001076f7:
    uVar6 = -(uint)(got_exit_signal != 0) | uVar6;
  }
  else {
    sVar20 = req->checkindex;
    req->pipelining = false;
    __n = req->offset - sVar20;
    req->checkindex = 0;
    req->offset = 0;
    if (req == (httprequest *)0x0 || __n == 0) {
      uVar13 = 0;
      goto LAB_00106cb6;
    }
    memmove(req,req->reqbuf + sVar20,__n);
    lVar8 = curlx_uztosz(__n);
LAB_00106cdb:
    if (got_exit_signal == 0) {
      if (lVar8 == 0) {
        logmsg("Connection closed by client");
      }
      else {
        if (-1 < lVar8) {
          logmsg("Read %zd bytes",lVar8);
          sVar20 = lVar8 + req->offset;
          req->offset = sVar20;
          req->reqbuf[sVar20] = '\0';
          pcVar18 = req->reqbuf + req->checkindex;
          pcVar9 = strstr(pcVar18,end_of_headers);
          iVar4 = req->callcount;
          req->callcount = iVar4 + 1;
          pcVar16 = "";
          if (0 < iVar4) {
            pcVar16 = " [CONTINUED]";
          }
          logmsg("Process %d bytes request%s",req->offset,pcVar16);
          if (use_gopher == '\x01') {
            if (req->testno != -4) goto LAB_00106efd;
            iVar4 = strncmp("/verifiedserver",pcVar18,0xf);
            if (iVar4 != 0) goto LAB_00106e37;
            logmsg("Are-we-friendly question received");
            req->testno = -2;
            bVar21 = true;
          }
          else {
            if (req->testno == -4) {
LAB_00106e37:
              iVar5 = __isoc99_sscanf(pcVar18,"%255s %139999s HTTP/%d.%d",ProcessRequest_request,
                                      &ProcessRequest_doc,&prot_major,&prot_minor);
              iVar7 = prot_major;
              iVar4 = prot_minor;
              if (iVar5 != 4) goto LAB_00106efd;
              req->prot_version = prot_major * 10 + prot_minor;
              pcVar16 = strrchr(&ProcessRequest_doc,0x2f);
              local_210 = pcVar16;
              if (pcVar16 != (char *)0x0) {
                local_218 = pcVar9;
                sVar11 = strlen(&ProcessRequest_doc);
                sVar12 = strlen(ProcessRequest_request);
                if (sVar12 + sVar11 < 400) {
                  curl_msnprintf(logbuf,0x1c8,"Got request: %s %s HTTP/%d.%d",ProcessRequest_request
                                 ,&ProcessRequest_doc,(ulong)(uint)iVar7,iVar4);
                }
                else {
                  curl_msnprintf(logbuf,0x1c8,"Got a *HUGE* request HTTP/%d.%d",(ulong)(uint)iVar7);
                }
                logmsg("%s",logbuf);
                iVar4 = strncmp("/verifiedserver",pcVar16,0xf);
                if (iVar4 == 0) {
                  lVar8 = -2;
                  pcVar18 = "Are-we-friendly question received";
                }
                else {
                  iVar4 = strncmp("/quit",pcVar16,5);
                  if (iVar4 != 0) {
                    do {
                      pcVar16 = pcVar16 + 1;
                      if (*pcVar16 == 0) break;
                      iVar4 = Curl_isdigit((uint)(byte)*pcVar16);
                    } while (iVar4 == 0);
                    local_210 = pcVar16;
                    uVar13 = strtol(pcVar16,&local_210,10);
                    req->testno = uVar13;
                    if (10000 < (long)uVar13) {
                      req->partno = uVar13 % 10000;
                      req->testno = uVar13 / 10000;
                      uVar13 = uVar13 / 10000;
LAB_00107030:
                      curl_msnprintf(logbuf,0x1c8,"Requested test number %ld part %ld",uVar13);
                      logmsg("%s",logbuf);
                      parse_servercmd(req);
                      pcVar9 = local_218;
                      goto LAB_0010706c;
                    }
                    req->partno = 0;
                    if (uVar13 != 0) goto LAB_00107030;
                    req->testno = -4;
                    pcVar9 = local_218;
                    goto LAB_0010707f;
                  }
                  lVar8 = -3;
                  pcVar18 = "Request-to-quit received";
                }
                logmsg(pcVar18);
                req->testno = lVar8;
                bVar21 = true;
                goto LAB_0010767b;
              }
LAB_0010706c:
              if (req->testno == -4) {
LAB_0010707f:
                iVar4 = __isoc99_sscanf(req,"CONNECT %139999s HTTP/%d.%d",&ProcessRequest_doc,
                                        &prot_major);
                if (iVar4 == 3) {
                  local_218 = pcVar9;
                  curl_msnprintf(logbuf,0x1c8,"Received a CONNECT %s HTTP/%d.%d request",
                                 &ProcessRequest_doc,(ulong)(uint)prot_major,(ulong)(uint)prot_minor
                                );
                  logmsg("%s");
                  pcVar9 = local_218;
                  req->connect_request = true;
                  if (req->prot_version == 10) {
                    req->open = false;
                  }
                  if (ProcessRequest_doc == '[') {
                    uVar13 = 0;
                    local_208 = "Invalid CONNECT IPv6 address format";
                    pbVar2 = &DAT_0010f781;
                    while (pbVar19 = pbVar2, *pbVar19 != 0) {
                      iVar4 = Curl_isxdigit((uint)*pbVar19);
                      if (((iVar4 == 0) && (bVar1 = *pbVar19, bVar1 != 0x2e)) && (bVar1 != 0x3a)) {
                        if (bVar1 == 0x5d) {
                          if (pbVar19[1] == 0x3a) {
                            pbVar19 = pbVar19 + 1;
                            goto LAB_001071db;
                          }
                          local_208 = "Invalid CONNECT IPv6 port format";
                        }
                        break;
                      }
                      uVar13 = strtoul((char *)pbVar19,&endp,0x10);
                      iVar4 = Curl_isxdigit((uint)*pbVar19);
                      pbVar2 = (byte *)endp;
                      if (iVar4 == 0) {
                        pbVar2 = pbVar19 + 1;
                      }
                    }
                    pbVar19 = (byte *)0x0;
                    logmsg(local_208);
LAB_001071db:
                    req->testno = uVar13;
                  }
                  else {
                    pbVar19 = (byte *)strchr(&ProcessRequest_doc,0x3a);
                    pcVar9 = local_218;
                  }
                  if (((pbVar19 != (byte *)0x0) && (pbVar19[1] != 0)) &&
                     (iVar4 = Curl_isdigit((uint)pbVar19[1]), iVar4 != 0)) {
                    uVar13 = strtoul((char *)(pbVar19 + 1),(char **)0x0,10);
                    if (uVar13 - 0x10000 < 0xffffffffffff0001) {
                      logmsg("Invalid CONNECT port received");
                    }
                    else {
                      uVar3 = curlx_ultous(uVar13);
                      req->connect_port = uVar3;
                    }
                  }
                  logmsg("Port number: %d, test case number: %ld",(ulong)req->connect_port,
                         req->testno);
                }
                if (req->testno == -4) {
                  pcVar16 = strstr(pcVar18,"\nTestno: ");
                  if (pcVar16 != (char *)0x0) {
                    lVar8 = strtol(pcVar16 + 9,(char **)0x0,10);
                    req->testno = lVar8;
                    logmsg("Found test number %d in Testno: header!",lVar8);
                    if (req->testno != -4) goto LAB_00107393;
                  }
                  pcVar16 = strrchr(&ProcessRequest_doc,0x2e);
                  if (pcVar16 != (char *)0x0) {
                    local_210 = pcVar16 + 1;
                    uVar13 = strtol(local_210,&local_210,10);
                    req->testno = uVar13;
                    if ((long)uVar13 < 0x2711) {
                      req->partno = 0;
                    }
                    else {
                      req->partno = uVar13 % 10000;
                      req->testno = uVar13 / 10000;
                      logmsg("found test %d in requested host name",uVar13 / 10000);
                      uVar13 = req->testno;
                    }
                    curl_msnprintf(logbuf,0x1c8,
                                   "Requested test number %ld part %ld (from host name)",uVar13);
                    logmsg("%s",logbuf);
                    if (req->testno == 0) {
                      logmsg("Did not find test number in PATH");
                      req->testno = -1;
                      goto LAB_00107393;
                    }
                  }
                  parse_servercmd(req);
                }
              }
            }
            else {
LAB_00106efd:
              if ((2 < req->offset) && (req->testno == -4)) {
                logmsg("** Unusual request. Starts with %02x %02x %02x",(ulong)(uint)(int)*pcVar18,
                       (ulong)(uint)(int)pcVar18[1],(ulong)(uint)(int)pcVar18[2]);
              }
            }
LAB_00107393:
            if (pcVar9 == (char *)0x0) {
              bVar21 = false;
              logmsg("request not complete yet");
            }
            else {
              logmsg("- request found to be complete");
              if ((use_gopher == '\x01') &&
                 (pcVar16 = strrchr(pcVar18,0x2f), pcVar16 != (char *)0x0)) {
                do {
                  pcVar16 = pcVar16 + 1;
                  if (*pcVar16 == 0) break;
                  iVar4 = Curl_isdigit((uint)(byte)*pcVar16);
                } while (iVar4 == 0);
                local_210 = pcVar16;
                uVar13 = strtol(pcVar16,&local_210,10);
                if ((long)uVar13 < 0x2711) {
                  uVar17 = 0;
                }
                else {
                  uVar17 = uVar13 % 10000;
                  uVar13 = uVar13 / 10000;
                }
                req->testno = uVar13;
                req->partno = uVar17;
                curl_msnprintf(logbuf,0x1c8,"Requested GOPHER test number %ld part %ld",uVar13);
                logmsg("%s",logbuf);
              }
              if (req->pipe != 0) {
                sVar11 = strlen(end_of_headers);
                req->checkindex = (size_t)(pcVar9 + req->checkindex + (sVar11 - (long)pcVar18));
              }
LAB_001074a5:
              if (got_exit_signal != 0) goto LAB_00107670;
              if ((req->cl != 0) ||
                 (iVar4 = Curl_strncasecompare("Content-Length:",pcVar18,0xf), iVar4 == 0)) {
                iVar4 = Curl_strncasecompare("Transfer-Encoding: chunked",pcVar18,0x1a);
                if (iVar4 == 0) goto code_r0x001074ec;
                pcVar18 = strstr(req->reqbuf,"\r\n0\r\n\r\n");
                bVar21 = pcVar18 != (char *)0x0;
                goto LAB_0010767b;
              }
              pcVar18 = pcVar18 + 0xf;
              while ((*pcVar18 != 0 && (iVar4 = Curl_isspace((uint)(byte)*pcVar18), iVar4 != 0))) {
                pcVar18 = pcVar18 + 1;
              }
              local_210 = pcVar18;
              piVar15 = __errno_location();
              *piVar15 = 0;
              uVar13 = strtoul(pcVar18,&local_210,10);
              if (((pcVar18 != local_210) &&
                  (iVar4 = Curl_isspace((uint)(byte)*local_210), iVar4 != 0)) && (*piVar15 != 0x22))
              {
                req->cl = uVar13 - (long)req->skip;
                logmsg("Found Content-Length: %lu in the request",uVar13);
                if (req->skip != 0) {
                  logmsg("... but will abort after %zu bytes",req->cl);
                }
LAB_00107500:
                if (((req->auth == false) &&
                    (pcVar18 = strstr(req->reqbuf,"Authorization:"), pcVar18 != (char *)0x0)) &&
                   (req->auth = true, req->auth_req == true)) {
                  logmsg("Authorization header found, as required");
                }
                pcVar18 = strstr(req->reqbuf,"Authorization: Negotiate");
                if (pcVar18 == (char *)0x0) {
                  if ((req->digest == false) &&
                     (pcVar18 = strstr(req->reqbuf,"Authorization: Digest"), pcVar18 != (char *)0x0)
                     ) {
                    sVar20 = req->partno + 1000;
                    req->partno = sVar20;
                    req->digest = true;
                    pcVar18 = "Received Digest request, sending back data %ld";
                  }
                  else if (req->ntlm == false) {
                    pcVar18 = strstr(req->reqbuf,"Authorization: NTLM TlRMTVNTUAAD");
                    if (pcVar18 == (char *)0x0) {
                      pcVar18 = strstr(req->reqbuf,"Authorization: NTLM TlRMTVNTUAAB");
                      if (pcVar18 == (char *)0x0) goto LAB_00107762;
                      sVar20 = req->partno + 0x3e9;
                      req->partno = sVar20;
                      req->ntlm = true;
                      pcVar18 = "Received NTLM type-1, sending back data %ld";
                    }
                    else {
                      req->partno = req->partno + 0x3ea;
                      req->ntlm = true;
                      logmsg("Received NTLM type-3, sending back data %ld");
                      sVar20 = req->cl;
                      if (sVar20 == 0) goto LAB_0010788f;
                      pcVar18 = "  Expecting %zu POSTed bytes";
                    }
                  }
                  else {
LAB_00107762:
                    lVar8 = req->partno;
                    if ((lVar8 < 1000) ||
                       (pcVar18 = strstr(req->reqbuf,"Authorization: Basic"), pcVar18 == (char *)0x0
                       )) goto LAB_0010788f;
                    sVar20 = lVar8 + 1;
                    req->partno = sVar20;
                    pcVar18 = "Received Basic request, sending back data %ld";
                  }
                  logmsg(pcVar18,sVar20);
                }
                else {
                  logmsg("Negotiate: prev_testno: %d, prev_partno: %d",ProcessRequest_prev_testno,
                         ProcessRequest_prev_partno);
                  if (req->testno == ProcessRequest_prev_testno) {
                    plVar14 = &ProcessRequest_prev_partno;
                  }
                  else {
                    plVar14 = &req->partno;
                    ProcessRequest_prev_testno = req->testno;
                  }
                  ProcessRequest_prev_partno = *plVar14 + 1;
                  req->partno = ProcessRequest_prev_partno;
                }
LAB_0010788f:
                pcVar18 = strstr(req->reqbuf,"Connection: close");
                if (pcVar18 != (char *)0x0) {
                  req->open = false;
                }
                iVar4 = req->pipe;
                pcVar18 = end_of_headers;
                if (((((iVar4 == 0) && (req->open == true)) && (10 < req->prot_version)) &&
                    ((sVar20 = req->offset, sVar11 = strlen(end_of_headers),
                     pcVar18 = end_of_headers, pcVar9 + sVar11 < req->reqbuf + sVar20 &&
                     (req->cl == 0)))) &&
                   (((req->reqbuf[0] == 'G' && ((req->reqbuf[1] == 'E' && (req->reqbuf[2] == 'T'))))
                    || (iVar7 = strncmp(req->reqbuf,"HEAD",4), pcVar18 = end_of_headers, iVar7 == 0)
                    ))) {
                  req->checkindex = (size_t)(pcVar9 + (sVar11 - (long)req));
                  req->pipelining = true;
                  pcVar18 = end_of_headers;
                }
                do {
                  iVar4 = iVar4 + -1;
                  if (iVar4 == -1) {
LAB_0010798b:
                    bVar21 = true;
                    if ((req->auth_req == true) && (req->auth == false)) {
                      logmsg("Return early due to auth requested by none provided");
                    }
                    else {
                      if ((req->upgrade == true) &&
                         (pcVar18 = strstr(req->reqbuf,"Upgrade:"), pcVar18 != (char *)0x0)) {
                        logmsg("Found Upgrade: in request and allows it");
                        req->upgrade_request = true;
                      }
                      uVar13 = req->cl;
                      bVar21 = true;
                      if (uVar13 != 0) {
                        sVar20 = req->offset;
                        sVar11 = strlen(end_of_headers);
                        bVar21 = uVar13 <= (long)req + (sVar20 - (long)(pcVar9 + sVar11));
                      }
                    }
                    goto LAB_0010767b;
                  }
                  if (got_exit_signal != 0) goto LAB_00107670;
                  sVar20 = req->checkindex;
                  pcVar9 = strstr(req->reqbuf + sVar20,pcVar18);
                  if (pcVar9 == (char *)0x0) {
                    pcVar9 = (char *)0x0;
                    goto LAB_0010798b;
                  }
                  sVar11 = strlen(pcVar18);
                  req->checkindex =
                       (size_t)(pcVar9 + sVar11 + (sVar20 - (long)(req->reqbuf + sVar20)));
                  req->pipe = iVar4;
                } while( true );
              }
              logmsg("Found invalid Content-Length: (%s) in the request",pcVar18);
              req->open = false;
LAB_00107670:
              bVar21 = true;
            }
          }
LAB_0010767b:
          req->done_processing = (uint)bVar21;
          if (got_exit_signal != 0) {
            return -1;
          }
          if ((bVar21 != false) && (req->pipe != 0)) {
            logmsg("Waiting for another piped request");
            req->done_processing = 0;
            req->pipe = req->pipe + -1;
          }
          uVar13 = req->offset;
          if (uVar13 == 149999) goto LAB_001076c5;
          if (149999 < uVar13) {
            pcVar18 = "Request buffer overflow, closing connection";
            goto LAB_001076cc;
          }
          req->reqbuf[uVar13] = '\0';
          uVar6 = 1;
          if (req->done_processing != 0) goto LAB_001076dd;
          goto LAB_001076f7;
        }
        puVar10 = (uint *)__errno_location();
        uVar6 = *puVar10;
        if (uVar6 == 0xb) {
          return 0;
        }
        pcVar18 = strerror(uVar6);
        logmsg("recv() returned error: (%d) %s",(ulong)uVar6,pcVar18);
      }
      req->reqbuf[req->offset] = '\0';
      storerequest(req->reqbuf,req->offset);
    }
    uVar6 = 0xffffffff;
  }
  return uVar6;
code_r0x001074ec:
  pcVar16 = strchr(pcVar18,10);
  pcVar18 = pcVar16 + 1;
  if (pcVar16 == (char *)0x0) goto LAB_00107500;
  goto LAB_001074a5;
}

Assistant:

static int get_request(curl_socket_t sock, struct httprequest *req)
{
  int error;
  int fail = 0;
  char *reqbuf = req->reqbuf;
  ssize_t got = 0;
  int overflow = 0;

  char *pipereq = NULL;
  size_t pipereq_length = 0;

  if(req->pipelining) {
    pipereq = reqbuf + req->checkindex;
    pipereq_length = req->offset - req->checkindex;

    /* Now that we've got the pipelining info we can reset the
       pipelining-related vars which were skipped in init_httprequest */
    req->pipelining = FALSE;
    req->checkindex = 0;
    req->offset = 0;
  }

  if(req->offset >= REQBUFSIZ-1) {
    /* buffer is already full; do nothing */
    overflow = 1;
  }
  else {
    if(pipereq_length && pipereq) {
      memmove(reqbuf, pipereq, pipereq_length);
      got = curlx_uztosz(pipereq_length);
      pipereq_length = 0;
    }
    else {
      if(req->skip)
        /* we are instructed to not read the entire thing, so we make sure to
           only read what we're supposed to and NOT read the enire thing the
           client wants to send! */
        got = sread(sock, reqbuf + req->offset, req->cl);
      else
        got = sread(sock, reqbuf + req->offset, REQBUFSIZ-1 - req->offset);
    }
    if(got_exit_signal)
      return -1;
    if(got == 0) {
      logmsg("Connection closed by client");
      fail = 1;
    }
    else if(got < 0) {
      error = SOCKERRNO;
      if(EAGAIN == error || EWOULDBLOCK == error) {
        /* nothing to read at the moment */
        return 0;
      }
      logmsg("recv() returned error: (%d) %s", error, strerror(error));
      fail = 1;
    }
    if(fail) {
      /* dump the request received so far to the external file */
      reqbuf[req->offset] = '\0';
      storerequest(reqbuf, req->offset);
      return -1;
    }

    logmsg("Read %zd bytes", got);

    req->offset += (size_t)got;
    reqbuf[req->offset] = '\0';

    req->done_processing = ProcessRequest(req);
    if(got_exit_signal)
      return -1;
    if(req->done_processing && req->pipe) {
      logmsg("Waiting for another piped request");
      req->done_processing = 0;
      req->pipe--;
    }
  }

  if(overflow || (req->offset == REQBUFSIZ-1 && got > 0)) {
    logmsg("Request would overflow buffer, closing connection");
    /* dump request received so far to external file anyway */
    reqbuf[REQBUFSIZ-1] = '\0';
    fail = 1;
  }
  else if(req->offset > REQBUFSIZ-1) {
    logmsg("Request buffer overflow, closing connection");
    /* dump request received so far to external file anyway */
    reqbuf[REQBUFSIZ-1] = '\0';
    fail = 1;
  }
  else
    reqbuf[req->offset] = '\0';

  /* at the end of a request dump it to an external file */
  if(fail || req->done_processing)
    storerequest(reqbuf, req->pipelining ? req->checkindex : req->offset);
  if(got_exit_signal)
    return -1;

  return fail ? -1 : 1;
}